

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_generator_generate_internal
              (secp256k1_context *ctx,secp256k1_generator *gen,uchar *key32,uchar *blind32)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int overflow;
  secp256k1_ge add;
  secp256k1_gej accum;
  uchar b32 [32];
  secp256k1_scalar blind;
  int local_1bc;
  secp256k1_fe local_1b8;
  secp256k1_ge local_190;
  secp256k1_gej local_138;
  uchar local_b8 [32];
  secp256k1_sha256 local_98;
  
  local_1b8.n[3] = 0;
  local_1b8.n[4] = 0;
  local_1b8.n[1] = 0;
  local_1b8.n[2] = 0;
  local_1b8.n[0] = 4;
  if (blind32 == (uchar *)0x0) {
    uVar3 = 1;
  }
  else {
    secp256k1_scalar_set_b32((secp256k1_scalar *)&local_98,blind32,&local_1bc);
    uVar3 = (uint)(local_1bc == 0);
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_138,(secp256k1_scalar *)&local_98);
  }
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  secp256k1_sha256_write(&local_98,"1st generation: ",0x10);
  secp256k1_sha256_write(&local_98,key32,0x20);
  secp256k1_sha256_finalize(&local_98,local_b8);
  uVar1 = secp256k1_fe_set_b32(&local_1b8,local_b8);
  shallue_van_de_woestijne(&local_190,&local_1b8);
  if (blind32 == (uchar *)0x0) {
    local_138.infinity = local_190.infinity;
    local_138.x.n[0] = local_190.x.n[0];
    local_138.x.n[1] = local_190.x.n[1];
    local_138.x.n[2] = local_190.x.n[2];
    local_138.x.n[3] = local_190.x.n[3];
    local_138.x.n[4] = local_190.x.n[4];
    local_138.y.n[0] = local_190.y.n[0];
    local_138.y.n[1] = local_190.y.n[1];
    local_138.y.n[2] = local_190.y.n[2];
    local_138.y.n[3] = local_190.y.n[3];
    local_138.y.n[4] = local_190.y.n[4];
    local_138.z.n[0] = 1;
    local_138.z.n[1] = 0;
    local_138.z.n[2] = 0;
    local_138.z.n[3] = 0;
    local_138.z.n[4] = 0;
  }
  else {
    secp256k1_gej_add_ge(&local_138,&local_138,&local_190);
  }
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  secp256k1_sha256_write(&local_98,"2nd generation: ",0x10);
  secp256k1_sha256_write(&local_98,key32,0x20);
  secp256k1_sha256_finalize(&local_98,local_b8);
  uVar2 = secp256k1_fe_set_b32(&local_1b8,local_b8);
  shallue_van_de_woestijne(&local_190,&local_1b8);
  secp256k1_gej_add_ge(&local_138,&local_138,&local_190);
  secp256k1_ge_set_gej(&local_190,&local_138);
  secp256k1_generator_save(gen,&local_190);
  return uVar2 & uVar1 & uVar3;
}

Assistant:

static int secp256k1_generator_generate_internal(const secp256k1_context* ctx, secp256k1_generator* gen, const unsigned char *key32, const unsigned char *blind32) {
    static const unsigned char prefix1[17] = "1st generation: ";
    static const unsigned char prefix2[17] = "2nd generation: ";
    secp256k1_fe t = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 4);
    secp256k1_ge add;
    secp256k1_gej accum;
    int overflow;
    secp256k1_sha256 sha256;
    unsigned char b32[32];
    int ret = 1;

    if (blind32) {
        secp256k1_scalar blind;
        secp256k1_scalar_set_b32(&blind, blind32, &overflow);
        ret = !overflow;
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &accum, &blind);
    }

    secp256k1_sha256_initialize(&sha256);
    secp256k1_sha256_write(&sha256, prefix1, 16);
    secp256k1_sha256_write(&sha256, key32, 32);
    secp256k1_sha256_finalize(&sha256, b32);
    ret &= secp256k1_fe_set_b32(&t, b32);
    shallue_van_de_woestijne(&add, &t);
    if (blind32) {
        secp256k1_gej_add_ge(&accum, &accum, &add);
    } else {
        secp256k1_gej_set_ge(&accum, &add);
    }

    secp256k1_sha256_initialize(&sha256);
    secp256k1_sha256_write(&sha256, prefix2, 16);
    secp256k1_sha256_write(&sha256, key32, 32);
    secp256k1_sha256_finalize(&sha256, b32);
    ret &= secp256k1_fe_set_b32(&t, b32);
    shallue_van_de_woestijne(&add, &t);
    secp256k1_gej_add_ge(&accum, &accum, &add);

    secp256k1_ge_set_gej(&add, &accum);
    secp256k1_generator_save(gen, &add);
    return ret;
}